

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elem_alg.c
# Opt level: O2

void pnga_step_bound_info_patch
               (Integer g_xx,Integer *xxlo,Integer *xxhi,Integer g_vv,Integer *vvlo,Integer *vvhi,
               Integer g_xxll,Integer *xxlllo,Integer *xxllhi,Integer g_xxuu,Integer *xxuulo,
               Integer *xxuuhi,void *boundmin,void *wolfemin,void *boundmax)

{
  double dVar1;
  int iVar2;
  Integer *pIVar3;
  int iVar4;
  Integer IVar5;
  logical lVar6;
  Integer IVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  double *alpha;
  long lVar13;
  bool bVar14;
  uint uVar15;
  ulong uVar16;
  float fVar17;
  double *local_460;
  double *local_458;
  Integer g_T;
  Integer g_Q;
  Integer xxndim;
  Integer g_S;
  Integer g_R;
  Integer xxtype;
  float fresult;
  int iresult;
  double *local_418;
  Integer local_410;
  Integer *local_408;
  Integer local_400;
  Integer xlndim;
  Integer vvndim;
  Integer xundim;
  long lresult;
  double dresult;
  float fresult2;
  int iresult2;
  float fbeta;
  float falpha;
  int ibeta;
  int ialpha;
  long local_3b8;
  long lbeta;
  long lalpha;
  double dbeta;
  double dalpha;
  Integer xutype;
  Integer xltype;
  long lresult2;
  double dresult2;
  Integer vvtype;
  Integer hiXX [7];
  Integer index [7];
  Integer loXX [7];
  Integer hiXU [7];
  Integer loXU [7];
  Integer xudims [7];
  Integer hiXL [7];
  Integer loXL [7];
  Integer xldims [7];
  Integer hiVV [7];
  Integer loVV [7];
  Integer vvdims [7];
  Integer xxdims [7];
  
  local_408 = vvhi;
  local_400 = g_xx;
  IVar5 = pnga_nodeid();
  iVar2 = _ga_sync_end;
  dalpha = 1.0;
  lbeta = -1;
  dbeta = -1.0;
  lalpha = 1;
  _ga_sync_end = 1;
  ibeta = -1;
  falpha = 1.0;
  fbeta = -1.0;
  bVar14 = _ga_sync_begin != 0;
  _ga_sync_begin = _ga_sync_end;
  ialpha = _ga_sync_end;
  if (bVar14) {
    pnga_sync();
  }
  IVar7 = local_400;
  pnga_check_handle(local_400,"pnga_step_bound_info_patch");
  pnga_check_handle(g_vv,"pnga_step_bound_info_patch");
  pnga_check_handle(g_xxll,"pnga_step_bound_info_patch");
  pnga_check_handle(g_xxuu,"pnga_step_bound_info_patch");
  pnga_inquire(IVar7,&xxtype,&xxndim,xxdims);
  local_410 = g_vv;
  pnga_inquire(g_vv,&vvtype,&vvndim,vvdims);
  pnga_inquire(g_xxll,&xltype,&xlndim,xldims);
  pnga_inquire(g_xxuu,&xutype,&xundim,xudims);
  if (xxtype != vvtype) {
    pnga_error(" pnga_step_bound_info_patch: types mismatch ",0);
  }
  if (xxtype != xltype) {
    pnga_error(" pnga_step_bound_info_patch: types mismatch ",0);
  }
  IVar7 = local_410;
  if (xxtype != xutype) {
    pnga_error(" pnga_step_bound_info_patch: types mismatch ",0);
  }
  for (lVar11 = 0; lVar11 < xxndim; lVar11 = lVar11 + 1) {
    if ((xxlo[lVar11] < 1) || (xxdims[lVar11] < xxhi[lVar11])) {
      pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ",local_400);
    }
  }
  for (lVar11 = 0; pIVar3 = local_408, lVar11 < vvndim; lVar11 = lVar11 + 1) {
    if ((vvlo[lVar11] < 1) || (vvdims[lVar11] < local_408[lVar11])) {
      pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ",IVar7);
    }
  }
  for (lVar11 = 0; lVar11 < xlndim; lVar11 = lVar11 + 1) {
    if ((xxlllo[lVar11] < 1) || (xldims[lVar11] < xxllhi[lVar11])) {
      pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ",g_xxll);
    }
  }
  for (lVar11 = 0; lVar11 < xundim; lVar11 = lVar11 + 1) {
    if ((xxuulo[lVar11] < 1) || (xudims[lVar11] < xxuuhi[lVar11])) {
      pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ",g_xxuu);
    }
  }
  lVar11 = 0;
  IVar7 = xxndim;
  if (xxndim < 1) {
    IVar7 = lVar11;
  }
  lVar13 = 1;
  for (; IVar7 != lVar11; lVar11 = lVar11 + 1) {
    lVar13 = lVar13 * ((xxhi[lVar11] - xxlo[lVar11]) + 1);
  }
  lVar11 = 0;
  IVar7 = vvndim;
  if (vvndim < 1) {
    IVar7 = lVar11;
  }
  lVar8 = 1;
  for (; IVar7 != lVar11; lVar11 = lVar11 + 1) {
    lVar8 = lVar8 * ((pIVar3[lVar11] - vvlo[lVar11]) + 1);
  }
  lVar11 = 0;
  IVar7 = xlndim;
  if (xlndim < 1) {
    IVar7 = lVar11;
  }
  lVar9 = 1;
  for (; IVar7 != lVar11; lVar11 = lVar11 + 1) {
    lVar9 = lVar9 * ((xxllhi[lVar11] - xxlllo[lVar11]) + 1);
  }
  lVar11 = 0;
  IVar7 = xundim;
  if (xundim < 1) {
    IVar7 = lVar11;
  }
  lVar12 = 1;
  for (; IVar7 != lVar11; lVar11 = lVar11 + 1) {
    lVar12 = lVar12 * ((xxuuhi[lVar11] - xxuulo[lVar11]) + 1);
  }
  if (lVar13 != lVar8) {
    pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ",0);
  }
  if (lVar13 != lVar9) {
    pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ",0);
  }
  pIVar3 = local_408;
  if (lVar13 != lVar12) {
    pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ",0);
  }
  pnga_distribution(local_400,IVar5,loXX,hiXX);
  pnga_distribution(local_410,IVar5,loVV,hiVV);
  pnga_distribution(g_xxll,IVar5,loXL,hiXL);
  pnga_distribution(g_xxuu,IVar5,loXU,hiXU);
  lVar6 = pnga_comp_patch(xxndim,loXX,hiXX,vvndim,loVV,hiVV);
  if ((lVar6 == 0) || (lVar6 = pnga_comp_patch(xxndim,xxlo,xxhi,vvndim,vvlo,pIVar3), lVar6 == 0)) {
    local_3b8 = 0;
  }
  else {
    local_3b8 = 1;
  }
  lVar6 = pnga_comp_patch(xxndim,loXX,hiXX,xlndim,loXL,hiXL);
  if ((lVar6 == 0) || (lVar6 = pnga_comp_patch(xxndim,xxlo,xxhi,xlndim,xxlllo,xxllhi), lVar6 == 0))
  {
    lVar11 = 0;
  }
  else {
    lVar11 = 1;
  }
  lVar6 = pnga_comp_patch(xxndim,loXX,hiXX,xundim,loXU,hiXU);
  if ((lVar6 == 0) || (lVar6 = pnga_comp_patch(xxndim,xxlo,xxhi,xundim,xxuulo,xxuuhi), lVar6 == 0))
  {
    lVar13 = 0;
  }
  else {
    lVar13 = 1;
  }
  local_3b8 = lVar13 * lVar11 * local_3b8;
  IVar5 = pnga_type_f2c(0x3f2);
  pnga_gop(IVar5,&local_3b8,1,"&&");
  if (local_3b8 == 0) {
    pnga_error(" pnga_step_bound_info_patch mismatched patchs ",0);
  }
  switch(xxtype) {
  case 0x3e9:
    local_458 = (double *)&ibeta;
    alpha = (double *)&ialpha;
    local_418 = (double *)&iresult2;
    local_460 = (double *)&iresult;
    break;
  case 0x3ea:
    local_458 = (double *)&lbeta;
    alpha = (double *)&lalpha;
    local_418 = (double *)&lresult2;
    local_460 = (double *)&lresult;
    break;
  case 0x3eb:
    local_458 = (double *)&fbeta;
    alpha = (double *)&falpha;
    local_418 = (double *)&fresult2;
    local_460 = (double *)&fresult;
    break;
  case 0x3ec:
    local_458 = &dbeta;
    alpha = &dalpha;
    local_418 = &dresult2;
    local_460 = &dresult;
    break;
  default:
    pcVar10 = "Ga_step_max_patch_: alpha/beta set wrong data type.";
    goto LAB_00111a91;
  case 0x3ee:
  case 0x3ef:
    pcVar10 = "Ga_step_bound_info_patch_: unavalable for complex datatype.";
LAB_00111a91:
    pnga_error(pcVar10,xxtype);
    local_460 = (double *)0x0;
    local_418 = (double *)0x0;
    alpha = (double *)0x0;
    local_458 = (double *)0x0;
  }
  IVar5 = local_400;
  pnga_duplicate(local_400,&g_Q,"TempQ");
  if (g_Q == 0) {
    pnga_error("pnga_step_bound_info_patch:fail to duplicate array Q",0);
  }
  pnga_duplicate(IVar5,&g_R,"TempR");
  if (g_R == 0) {
    pnga_error("pnga_step_bound_info_patch:fail to duplicate array R",0);
  }
  pnga_duplicate(IVar5,&g_S,"TempS");
  if (g_S == 0) {
    pnga_error("pnga_step_bound_info_patch:fail to duplicate array S",0);
  }
  pnga_duplicate(IVar5,&g_T,"TempT");
  if (g_T == 0) {
    pnga_error("pnga_step_bound_info_patch:fail to duplicate array T",0);
  }
  pnga_add_patch(alpha,g_xxuu,xxuulo,xxuuhi,local_458,IVar5,xxlo,xxhi,g_S,xxlo,xxhi);
  IVar7 = has_negative_elem(g_S,xxlo,xxhi);
  pIVar3 = local_408;
  if (IVar7 == 1) {
    pnga_error("pnga_step_bound_info_patch: Upper bound is not > xx.",-1);
  }
  pnga_zero(g_T);
  pnga_elem_maximum(local_410,g_T,g_T);
  pnga_elem_stepb_divide_patch(g_S,xxlo,xxhi,g_T,vvlo,pIVar3,g_T,xxlo,xxhi);
  pnga_select_elem(g_T,"min",local_460,index);
  if (3 < xxtype - 0x3e9U) {
    if (xxtype - 0x3eeU < 2) {
      pcVar10 = "Ga_step_bound_info_patch_: unavalable for complex datatype.";
    }
    else {
      pcVar10 = "Ga_step_bound_info_patch_: result set: wrong data type.";
    }
    pnga_error(pcVar10,xxtype);
  }
  pnga_add_patch(alpha,IVar5,xxlo,xxhi,local_458,g_xxll,xxlllo,xxllhi,g_Q,xxlo,xxhi);
  IVar5 = has_negative_elem(g_Q,xxlo,xxhi);
  if (IVar5 == 1) {
    pnga_error("pnga_step_bound_info_patch: Lower bound is not < xx.",-1);
  }
  pnga_zero(g_R);
  pnga_elem_minimum(local_410,g_R,g_R);
  pnga_abs_value(g_R);
  pnga_elem_stepb_divide_patch(g_Q,xxlo,xxhi,g_R,vvlo,pIVar3,g_R,xxlo,xxhi);
  pnga_select_elem(g_R,"min",local_418,index);
  switch(xxtype) {
  case 0x3e9:
    if (iresult < iresult2) {
      iresult2 = iresult;
    }
    iVar4 = -iresult2;
    if (0 < iresult2) {
      iVar4 = iresult2;
    }
    *(int *)wolfemin = iVar4;
    break;
  case 0x3ea:
    if (lresult < lresult2) {
      lresult2 = lresult;
    }
    lVar11 = -lresult2;
    if (0 < lresult2) {
      lVar11 = lresult2;
    }
    *(long *)wolfemin = lVar11;
    break;
  case 0x3eb:
    fVar17 = (float)(~-(uint)(fresult <= fresult2) & (uint)fresult2 |
                    (uint)fresult & -(uint)(fresult <= fresult2));
    uVar15 = -(uint)(fVar17 < -fVar17);
    *(uint *)wolfemin = ~uVar15 & (uint)fVar17 | (uint)-fVar17 & uVar15;
    break;
  case 0x3ec:
    dVar1 = (double)(~-(ulong)(dresult <= dresult2) & (ulong)dresult2 |
                    (ulong)dresult & -(ulong)(dresult <= dresult2));
    uVar16 = -(ulong)(dVar1 < -dVar1);
    *(ulong *)wolfemin = ~uVar16 & (ulong)dVar1 | (ulong)-dVar1 & uVar16;
    break;
  default:
    pcVar10 = "Ga_step_bound_info_patch_: result2 set: wrong data type.";
    goto LAB_00111e33;
  case 0x3ee:
  case 0x3ef:
    pcVar10 = "Ga_step_bound_info_patch_: unavalable for complex datatype.";
LAB_00111e33:
    pnga_error(pcVar10,xxtype);
  }
  pnga_elem_minimum(g_R,g_T,g_T);
  pnga_elem_multiply(g_Q,g_S,g_S);
  pnga_copy(local_410,g_Q);
  pnga_abs_value(g_Q);
  pnga_add_patch(alpha,g_Q,xxlo,xxhi,alpha,g_S,xxlo,xxhi,g_S,xxlo,xxhi);
  pnga_step_mask_patch(g_S,xxlo,xxhi,g_T,xxlo,xxhi,g_T,xxlo,xxhi);
  pnga_select_elem(g_T,"min",local_460,index);
  switch(xxtype) {
  case 0x3e9:
    *(int *)boundmin = iresult;
    break;
  case 0x3ea:
    *(long *)boundmin = lresult;
    break;
  case 0x3eb:
    *(float *)boundmin = fresult;
    break;
  case 0x3ec:
    *(double *)boundmin = dresult;
    break;
  default:
    pcVar10 = "Ga_step_bound_info_patch_: result set: wrong data type.";
    goto LAB_00111fa9;
  case 0x3ee:
  case 0x3ef:
    pcVar10 = "Ga_step_bound_info_patch_: unavalable for complex datatype.";
LAB_00111fa9:
    pnga_error(pcVar10,xxtype);
  }
  pnga_select_elem(g_T,"max",local_460,index);
  switch(xxtype) {
  case 0x3e9:
    *(int *)boundmax = iresult;
    break;
  case 0x3ea:
    *(long *)boundmax = lresult;
    break;
  case 0x3eb:
    *(float *)boundmax = fresult;
    break;
  case 0x3ec:
    *(double *)boundmax = dresult;
    break;
  default:
    pcVar10 = "Ga_step_bound_info_patch_: result set: wrong data type.";
    goto LAB_00112050;
  case 0x3ee:
  case 0x3ef:
    pcVar10 = "Ga_step_bound_info_patch_: unavalable for complex datatype.";
LAB_00112050:
    pnga_error(pcVar10,xxtype);
  }
  pnga_destroy(g_Q);
  pnga_destroy(g_R);
  pnga_destroy(g_S);
  pnga_destroy(g_T);
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_step_bound_info_patch(
     Integer g_xx, Integer *xxlo, Integer *xxhi,    /* patch of g_xx */
     Integer g_vv, Integer *vvlo, Integer *vvhi,    /* patch of g_vv */
     Integer g_xxll, Integer *xxlllo, Integer *xxllhi,    /* patch of g_xxll */
     Integer g_xxuu, Integer *xxuulo, Integer *xxuuhi,    /* patch of g_xxuu */
     void *boundmin, void* wolfemin, void *boundmax)
{
     /*double  result1,result2;*/
     double  dresult,dresult2;
     long    lresult,lresult2;

     Integer index[MAXDIM];
     Integer xxtype;
     Integer xxndim, xxdims[MAXDIM];
     Integer loXX[MAXDIM], hiXX[MAXDIM];
     Integer vvtype;
     Integer vvndim, vvdims[MAXDIM];
     Integer loVV[MAXDIM], hiVV[MAXDIM];
     Integer xxtotal,vvtotal;
     Integer xltype;
     Integer xlndim, xldims[MAXDIM];
     Integer loXL[MAXDIM], hiXL[MAXDIM];
     Integer xutype;
     Integer xundim, xudims[MAXDIM];
     Integer loXU[MAXDIM], hiXU[MAXDIM];
     Integer xltotal,xutotal;
     Integer me= pnga_nodeid();
     Integer g_Q;
     Integer g_R;
     Integer g_S;
     Integer g_T;
     double dalpha = (double)1.0, dbeta = (double)(-1.0);
     long   lalpha = (long)1, lbeta = (long)(-1);
     int ialpha = (int)1, ibeta = (int)(-1);
     float   falpha = (float)1.0, fbeta = (float)(-1.0);
     int iresult,iresult2;
     float   fresult,fresult2;
     Integer compatible;
     Integer compatible2;
     Integer compatible3;
     void *sresult = NULL;
     void *sresult2 = NULL;
     void *alpha = NULL,*beta = NULL;
     int local_sync_begin,local_sync_end;
     int i;

     local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
     _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
     if(local_sync_begin)pnga_sync();

     /* Check for valid ga handles. */

     pnga_check_handle(g_xx, "pnga_step_bound_info_patch");
     pnga_check_handle(g_vv, "pnga_step_bound_info_patch");
     pnga_check_handle(g_xxll, "pnga_step_bound_info_patch");
     pnga_check_handle(g_xxuu, "pnga_step_bound_info_patch");


     /* get chaacteristics of the input ga patches */

     pnga_inquire(g_xx, &xxtype, &xxndim, xxdims);
     pnga_inquire(g_vv, &vvtype, &vvndim, vvdims);
     pnga_inquire(g_xxll, &xltype, &xlndim, xldims);
     pnga_inquire(g_xxuu, &xutype, &xundim, xudims);

     /* Check for matching types. */

     if(xxtype != vvtype) pnga_error(" pnga_step_bound_info_patch: types mismatch ", 0L); 
     if(xxtype != xltype) pnga_error(" pnga_step_bound_info_patch: types mismatch ", 0L); 
     if(xxtype != xutype) pnga_error(" pnga_step_bound_info_patch: types mismatch ", 0L); 

     /* check if patch indices and dims match */
     for(i=0; i<xxndim; i++)
       if(xxlo[i] <= 0 || xxhi[i] > xxdims[i])
	 pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ", g_xx);

     for(i=0; i<vvndim; i++)
       if(vvlo[i] <= 0 || vvhi[i] > vvdims[i])
	 pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ", g_vv);

     for(i=0; i<xlndim; i++)
       if(xxlllo[i] <= 0 || xxllhi[i] > xldims[i])
	 pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ", g_xxll);
     for(i=0; i<xundim; i++)
       if(xxuulo[i] <= 0 || xxuuhi[i] > xudims[i])
	 pnga_error("ga_elem_step_bound_info_patch: g_a indices out of range ", g_xxuu);
     
     /* check if numbers of elements in patches match each other */
     xxtotal = 1; for(i=0; i<xxndim; i++) xxtotal *= (xxhi[i] - xxlo[i] + 1);
     vvtotal = 1; for(i=0; i<vvndim; i++) vvtotal *= (vvhi[i] - vvlo[i] + 1);
     xltotal = 1; for(i=0; i<xlndim; i++) xltotal *= (xxllhi[i] - xxlllo[i] + 1);
     xutotal = 1; for(i=0; i<xundim; i++) xutotal *= (xxuuhi[i] - xxuulo[i] + 1);
 
     if(xxtotal != vvtotal)
        pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ", 0L);
     if(xxtotal != xltotal)
        pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ", 0L);
     if(xxtotal != xutotal)
        pnga_error(" pnga_step_bound_info_patch capacities of patches do not match ", 0L);
     /* find out coordinates of patches of g_a, and g_b that I own */
     pnga_distribution(g_xx, me, loXX, hiXX);
     pnga_distribution(g_vv, me, loVV, hiVV);
     pnga_distribution(g_xxll, me, loXL, hiXL);
     pnga_distribution(g_xxuu, me, loXU, hiXU);
     

     /* test if the local portion of patches matches */
     if(pnga_comp_patch(xxndim, loXX, hiXX, vvndim, loVV, hiVV) &&
	pnga_comp_patch(xxndim, xxlo, xxhi, vvndim, vvlo, vvhi)) {
       compatible = 1;
     }
     else {
       compatible = 0;
     }
     if(pnga_comp_patch(xxndim, loXX, hiXX, xlndim, loXL, hiXL) &&
	pnga_comp_patch(xxndim, xxlo, xxhi, xlndim, xxlllo, xxllhi)) {
       compatible2 = 1;
     }
     else {
       compatible2 = 0;
     }
     if(pnga_comp_patch(xxndim, loXX, hiXX, xundim, loXU, hiXU) &&
	pnga_comp_patch(xxndim, xxlo, xxhi, xundim, xxuulo, xxuuhi)) {
       compatible3 = 1;
     }
     else {
       compatible3 = 0;
     }
     compatible = compatible * compatible2 * compatible3;
     /* pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "*"); */
     pnga_gop(pnga_type_f2c(MT_F_INT), &compatible, 1, "&&");
     if(!compatible) {
       pnga_error(" pnga_step_bound_info_patch mismatched patchs ",0);
     }
     switch (xxtype)
       {
       case C_INT:
	 /* This should point to iresult but we use lresult
	    due to the strange implementation if pnga_select_elem.
	 */
	 sresult = &iresult;
	 sresult2 = &iresult2;
	 alpha    = &ialpha;
	 beta     = &ibeta;
	 break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 sresult = &dresult;
	 sresult2 = &dresult2;
	 alpha    = &dalpha;
	 beta     = &dbeta;
	 break;
       case C_FLOAT:
	 sresult = &fresult;
	 sresult2 = &fresult2;
	 alpha    = &falpha;
	 beta     = &fbeta;
	 break;
       case C_LONG:
	 sresult = &lresult;
	 sresult2 = &lresult2;
	 alpha    = &lalpha;
	 beta     = &lbeta;
	 break;
       default:
	 pnga_error("Ga_step_max_patch_: alpha/beta set wrong data type.", xxtype);
       }

     /*duplicatecate an array Q to hold the temparary result */
     pnga_duplicate(g_xx, &g_Q, "TempQ");
     if(g_Q==0)
       pnga_error("pnga_step_bound_info_patch:fail to duplicate array Q", g_Q);
     
     /*duplicatecate an array R to hold the temparary result */
     pnga_duplicate(g_xx, &g_R, "TempR");
     if(g_R==0)
       pnga_error("pnga_step_bound_info_patch:fail to duplicate array R", g_R);

     /*duplicatecate an array s to hold the temparary result */
     pnga_duplicate(g_xx, &g_S, "TempS");
     if(g_S==0)
       pnga_error("pnga_step_bound_info_patch:fail to duplicate array S", g_S);
     
     /*duplicatecate an array T to hold the temparary result */
     pnga_duplicate(g_xx, &g_T, "TempT");
     if(g_T==0)
       pnga_error("pnga_step_bound_info_patch:fail to duplicate array T", g_T);

     /*First, compute xu - xx */
     pnga_add_patch(alpha, g_xxuu, xxuulo, xxuuhi, beta, g_xx, xxlo, xxhi, g_S, xxlo, xxhi); 

     /*Check for negative elements in g_s, if it has any then xxuu was
       not an upper bound, exit with error message.
     */
     if(has_negative_elem(g_S, xxlo, xxhi) == 1)
       pnga_error("pnga_step_bound_info_patch: Upper bound is not > xx.", -1);

     /* Then compute t = positve elements of vv */
     pnga_zero(g_T);
     pnga_elem_maximum(g_vv,g_T,g_T);

     /* Then, compute (xu-xx)/vv */
     pnga_elem_stepb_divide_patch(g_S, xxlo, xxhi, g_T, vvlo, vvhi, g_T, xxlo, xxhi); 

     /* Then, we will select the minimum of the array g_t*/ 
     pnga_select_elem(g_T, "min", sresult, &index[0]); 

     switch (xxtype)
       {
       case C_INT:
	 /* This should be iresult but is lresult because of
	    the strange implementation of nga_select_elem.
	 */
           /* result1 = (double)(iresult); */
           break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 /* result1 = dresult; */
	 break;
       case C_FLOAT:
	 /* result1 = (double)fresult; */
	 break;
       case C_LONG:
	 /* result1 = (double)lresult; */
	 break;
       default:
	 pnga_error("Ga_step_bound_info_patch_: result set: wrong data type.", xxtype);
       }

     /*Now doing the same thing to get (xx-xxll)/dv */
     /*First, compute xl - xx */
     pnga_add_patch(alpha, g_xx, xxlo, xxhi, beta, g_xxll, xxlllo, xxllhi, g_Q, xxlo, xxhi); 
     /*Check for negative elements in g_s, if it has any then xxll was
       not a lower bound, exit with error message.
     */
     if(has_negative_elem(g_Q, xxlo, xxhi) == 1)
       pnga_error("pnga_step_bound_info_patch: Lower bound is not < xx.", -1);

     /* Then compute r = negative elements of vv */
     pnga_zero(g_R);
     pnga_elem_minimum(g_vv,g_R,g_R);
     pnga_abs_value(g_R);

     /* Then, compute (xx-xl)/vv */
     pnga_elem_stepb_divide_patch(g_Q, xxlo, xxhi, g_R, vvlo, vvhi, g_R, xxlo, xxhi); 
     /* Then, we will select the minimum of the array g_t*/ 
     pnga_select_elem(g_R, "min", sresult2, &index[0]); 
     switch (xxtype)
       {
       case C_INT:
	 *(int*)wolfemin = GA_ABS(GA_MIN(iresult,iresult2));
	 break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 *(double*)wolfemin = GA_ABS(GA_MIN(dresult,dresult2));
	 break;
       case C_FLOAT:
	 *(float*)wolfemin = GA_ABS(GA_MIN(fresult,fresult2));
	 break;
       case C_LONG:
	 *(long*)wolfemin =  GA_ABS(GA_MIN(lresult,lresult2));
	 break;
       default:
	 pnga_error("Ga_step_bound_info_patch_: result2 set: wrong data type.", xxtype);
       }
     /* 
       Now set T to be the elementwise minimum of R and T. 
       So, T is infinity only where ever g_vv is zero.
     */
     pnga_elem_minimum(g_R,g_T,g_T);
     /*
       Now we want to set T to be zero whenever g_vv was zero
       and gxx coincides with either boundary vector.
       Set S to be the element-wise product of S and Q.
       It will be zero when either of them is zero.
     */
     pnga_elem_multiply(g_Q,g_S,g_S);
     /*
       Set Q to the |vv|.
     */
     pnga_copy(g_vv,g_Q);
     pnga_abs_value(g_Q);
     /* 
       Now add q and s to get a vector that is zero only
       where g_vv was zero and g_xx meets one of the
       boundary vectors.
     */
     pnga_add_patch(alpha, g_Q, xxlo, xxhi, alpha, g_S, xxlo, xxhi, g_S, xxlo, xxhi); 
     /* 
       Then use that vector as a mask to set certain
       elements of T to be zero (so we have a collection
       of the a_i and c_i elements as per the TAO StepBoundInfo
       function).
     */
     pnga_step_mask_patch(g_S,xxlo,xxhi,g_T,xxlo,xxhi,g_T,xxlo,xxhi);

     /* 
       Then, we will select the minimum of the array g_t, that will
       be boundmin .
     */ 
     pnga_select_elem(g_T, "min", sresult, &index[0]); 
     switch (xxtype)
       {
       case C_INT:
	 /* This should be iresult but is lresult because of
	    the strange implementation of nga_select_elem.
	 */
           *(int*)boundmin = iresult;
           break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 *(double*)boundmin = dresult;
	 break;
       case C_FLOAT:
	 *(float*)boundmin = fresult;
	 break;
       case C_LONG:
	 *(long*)boundmin = lresult;
	 break;
       default:
	 pnga_error("Ga_step_bound_info_patch_: result set: wrong data type.", xxtype);
       }
     /* 
       Then, we will select the maximum of the array g_t, that will
       be boundmax .
     */ 
     pnga_select_elem(g_T, "max", sresult, &index[0]); 
     switch (xxtype)
       {
       case C_INT:
	 /* This should be iresult but is lresult because of
	    the strange implementation of nga_select_elem.
	 */
           *(int*)boundmax = iresult;
           break;
       case C_DCPL:
       case C_SCPL:
	 pnga_error("Ga_step_bound_info_patch_: unavalable for complex datatype.", 
		   xxtype);
	 break;
       case C_DBL:
	 *(double*)boundmax = dresult;
	 break;
       case C_FLOAT:
	 *(float*)boundmax = fresult;
	 break;
       case C_LONG:
	 *(long*)boundmax = lresult;
	 break;
       default:
	 pnga_error("Ga_step_bound_info_patch_: result set: wrong data type.", xxtype);
       }
     pnga_destroy(g_Q); 
     pnga_destroy(g_R); 
     pnga_destroy(g_S); 
     pnga_destroy(g_T); 
     if(local_sync_end)pnga_sync();
}